

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O1

Amount __thiscall cfd::Psbt::GetFeeAmount(Psbt *this)

{
  void *pvVar1;
  long lVar2;
  bool bVar3;
  CfdException *pCVar4;
  ulong uVar5;
  int64_t *piVar6;
  undefined8 extraout_RDX;
  long lVar7;
  ulong uVar8;
  long lVar9;
  Amount AVar10;
  Amount AVar11;
  Amount total_output;
  Amount total_input;
  undefined1 local_70 [32];
  Amount local_50;
  Amount local_40;
  
  bVar3 = HasAllUtxos(this);
  if (bVar3) {
    pvVar1 = (this->super_Psbt).wally_psbt_pointer_;
    core::Amount::Amount(&local_40);
    if (*(long *)((long)pvVar1 + 0x18) != 0) {
      lVar9 = 8;
      lVar7 = 0x20;
      uVar8 = 0;
      do {
        piVar6 = *(int64_t **)(*(long *)((long)pvVar1 + 0x10) + lVar9);
        if (piVar6 == (int64_t *)0x0) {
          lVar2 = *(long *)(*(long *)((long)pvVar1 + 0x10) + -8 + lVar9);
          if (lVar2 == 0) {
            local_70._0_8_ = "cfd_psbt.cpp";
            local_70._8_4_ = 0x113;
            local_70._16_8_ = "GetFeeAmount";
            core::logger::log<>((CfdSourceLocation *)local_70,kCfdLogLevelWarning,
                                "psbt txin utxo is empty.");
            pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
            local_70._0_8_ = local_70 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_70,"psbt txin utxo is empty.","");
            core::CfdException::CfdException(pCVar4,kCfdIllegalStateError,(string *)local_70);
            __cxa_throw(pCVar4,&core::CfdException::typeinfo,core::CfdException::~CfdException);
          }
          uVar5 = (ulong)*(uint *)(*(long *)(*(long *)((long)pvVar1 + 8) + 8) + lVar7);
          if (*(ulong *)(lVar2 + 0x28) <= uVar5) {
            local_70._0_8_ = "cfd_psbt.cpp";
            local_70._8_4_ = 0x10d;
            local_70._16_8_ = "GetFeeAmount";
            core::logger::log<>((CfdSourceLocation *)local_70,kCfdLogLevelWarning,
                                "psbt txin vout is invalid.");
            pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
            local_70._0_8_ = local_70 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_70,"psbt txin vout is invalid.","");
            core::CfdException::CfdException(pCVar4,kCfdIllegalStateError,(string *)local_70);
            __cxa_throw(pCVar4,&core::CfdException::typeinfo,core::CfdException::~CfdException);
          }
          piVar6 = (int64_t *)(uVar5 * 0x70 + *(long *)(lVar2 + 0x20));
        }
        core::Amount::operator+=(&local_40,*piVar6);
        uVar8 = uVar8 + 1;
        lVar9 = lVar9 + 0x110;
        lVar7 = lVar7 + 0xd0;
      } while (uVar8 < *(ulong *)((long)pvVar1 + 0x18));
    }
    core::Amount::Amount((Amount *)local_70);
    lVar7 = *(long *)((long)pvVar1 + 8);
    if (*(long *)(lVar7 + 0x28) != 0) {
      lVar9 = 0;
      uVar8 = 0;
      do {
        core::Amount::operator+=((Amount *)local_70,*(int64_t *)(*(long *)(lVar7 + 0x20) + lVar9));
        uVar8 = uVar8 + 1;
        lVar7 = *(long *)((long)pvVar1 + 8);
        lVar9 = lVar9 + 0x70;
      } while (uVar8 < *(ulong *)(lVar7 + 0x28));
    }
    bVar3 = core::operator<=(&local_40,(Amount *)local_70);
    if (!bVar3) {
      AVar10 = core::operator-(&local_40,(Amount *)local_70);
      local_50.ignore_check_ = AVar10.ignore_check_;
      goto LAB_003b0bd8;
    }
  }
  core::Amount::Amount(&local_50);
  AVar10._8_8_ = extraout_RDX;
  AVar10.amount_ = local_50.amount_;
LAB_003b0bd8:
  local_50.amount_ = AVar10.amount_;
  AVar11._9_7_ = AVar10._9_7_;
  AVar11.ignore_check_ = local_50.ignore_check_;
  AVar11.amount_ = local_50.amount_;
  return AVar11;
}

Assistant:

Amount Psbt::GetFeeAmount() const {
  if (!HasAllUtxos()) return Amount();
  struct wally_psbt* psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt*>(wally_psbt_pointer_);

  Amount total_input;
  for (size_t index = 0; index < psbt_pointer->num_inputs; ++index) {
    if (psbt_pointer->inputs[index].witness_utxo != nullptr) {
      total_input += psbt_pointer->inputs[index].witness_utxo->satoshi;
    } else if (psbt_pointer->inputs[index].utxo != nullptr) {
      uint32_t vout = psbt_pointer->tx->inputs[index].index;
      if (psbt_pointer->inputs[index].utxo->num_outputs <= vout) {
        warn(CFD_LOG_SOURCE, "psbt txin vout is invalid.");
        throw CfdException(
            CfdError::kCfdIllegalStateError, "psbt txin vout is invalid.");
      }
      total_input += psbt_pointer->inputs[index].utxo->outputs[vout].satoshi;
    } else {
      warn(CFD_LOG_SOURCE, "psbt txin utxo is empty.");
      throw CfdException(
          CfdError::kCfdIllegalStateError, "psbt txin utxo is empty.");
    }
  }

  Amount total_output;
  for (size_t index = 0; index < psbt_pointer->tx->num_outputs; ++index) {
    total_output += psbt_pointer->tx->outputs[index].satoshi;
  }

  if (total_input <= total_output) return Amount();
  return total_input - total_output;
}